

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void concatwsFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int nSep;
  uchar *zSep;
  
  nSep = sqlite3_value_bytes(*argv);
  zSep = sqlite3_value_text(*argv);
  if (zSep != (uchar *)0x0) {
    concatFuncCore(context,argc + -1,argv + 1,nSep,(char *)zSep);
    return;
  }
  return;
}

Assistant:

static void concatwsFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int nSep = sqlite3_value_bytes(argv[0]);
  const char *zSep = (const char*)sqlite3_value_text(argv[0]);
  if( zSep==0 ) return;
  concatFuncCore(context, argc-1, argv+1, nSep, zSep);
}